

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmListFileBacktrace __thiscall cmMakefile::GetBacktrace(cmMakefile *this,cmCommandContext *cc)

{
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  cmListFileBacktrace cVar1;
  string local_98;
  undefined1 local_68 [8];
  cmListFileContext lfc;
  cmCommandContext *cc_local;
  cmMakefile *this_local;
  
  lfc.Line = in_RDX;
  cmListFileContext::cmListFileContext((cmListFileContext *)local_68);
  std::__cxx11::string::operator=((string *)local_68,(string *)(lfc.Line + 0x20));
  lfc.FilePath.field_2._8_8_ = *(undefined8 *)(lfc.Line + 0x40);
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_98,(cmStateSnapshot *)(cc + 10));
  std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_98)
  ;
  std::__cxx11::string::~string((string *)&local_98);
  cmListFileBacktrace::Push
            ((cmListFileBacktrace *)this,(cmListFileContext *)((long)&cc[10].Name.Lower.field_2 + 8)
            );
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_68);
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar1.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace(cmCommandContext const& cc) const
{
  cmListFileContext lfc;
  lfc.Name = cc.Name.Original;
  lfc.Line = cc.Line;
  lfc.FilePath = this->StateSnapshot.GetExecutionListFile();
  return this->Backtrace.Push(lfc);
}